

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDAReInitB(void *ida_mem,int which,sunrealtype tB0,N_Vector yyB0,N_Vector ypB0)

{
  int *piVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar4 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x39e;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    iVar4 = -0x65;
    error_code = -0x65;
    iVar2 = 0x3a9;
  }
  else {
    pdVar3 = *(double **)((long)ida_mem + 0x840);
    if ((tB0 < *pdVar3) || (pdVar3[1] <= tB0 && tB0 != pdVar3[1])) {
      msgfmt = 
      "The initial time tB0 is outside the interval over which the forward problem was solved.";
      iVar4 = -0x68;
      error_code = -0x68;
      iVar2 = 0x3b3;
    }
    else {
      if (which < *(int *)(pdVar3 + 7)) {
        pdVar3 = pdVar3 + 6;
        do {
          piVar1 = (int *)*pdVar3;
          pdVar3 = (double *)(piVar1 + 0x20);
        } while (*piVar1 != which);
        iVar2 = IDAReInit(*(void **)(piVar1 + 4),tB0,yyB0,ypB0);
        return iVar2;
      }
      msgfmt = "Illegal value for which.";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x3bc;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDAReInitB",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int IDAReInitB(void* ida_mem, int which, sunrealtype tB0, N_Vector yyB0,
               N_Vector ypB0)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  void* ida_memB;
  int flag;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the initial time for this backward problem against the adjoint data. */
  if ((tB0 < IDAADJ_mem->ia_tinitial) || (tB0 > IDAADJ_mem->ia_tfinal))
  {
    IDAProcessError(IDA_mem, IDA_BAD_TB0, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_TB0);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_TB0);
  }

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get the IDAMem corresponding to this backward problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Call the IDAReInit for this backward problem. */
  flag = IDAReInit(ida_memB, tB0, yyB0, ypB0);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (flag);
}